

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint32_t helper_m68k_movec_from_m68k(CPUM68KState_conflict *env,uint32_t reg)

{
  switch(reg) {
  case 0:
    return env->sfc;
  case 1:
    return env->dfc;
  case 2:
    return env->cacr;
  case 3:
    return (uint32_t)(env->mmu).tcr;
  case 4:
    return (env->mmu).ttr[2];
  case 5:
    return (env->mmu).ttr[3];
  case 6:
    return (env->mmu).ttr[0];
  case 7:
    return (env->mmu).ttr[1];
  }
  switch(reg) {
  case 0x800:
    return env->sp[1];
  case 0x801:
    return env->vbr;
  default:
    cpu_abort_m68k((CPUState *)(env[-0x40].fregs + 2),"Unimplemented control register read 0x%x\n");
  case 0x803:
    return env->sp[0];
  case 0x804:
    return env->sp[2];
  case 0x805:
    return (env->mmu).mmusr;
  case 0x806:
    return (env->mmu).urp;
  case 0x807:
    return (env->mmu).srp;
  }
}

Assistant:

uint32_t HELPER(m68k_movec_from)(CPUM68KState *env, uint32_t reg)
{
    switch (reg) {
    /* MC680[1234]0 */
    case M68K_CR_SFC:
        return env->sfc;
    case M68K_CR_DFC:
        return env->dfc;
    case M68K_CR_VBR:
        return env->vbr;
    /* MC680[234]0 */
    case M68K_CR_CACR:
        return env->cacr;
    /* MC680[34]0 */
    case M68K_CR_TC:
        return env->mmu.tcr;
    case M68K_CR_MMUSR:
        return env->mmu.mmusr;
    case M68K_CR_SRP:
        return env->mmu.srp;
    case M68K_CR_USP:
        return env->sp[M68K_USP];
    case M68K_CR_MSP:
        return env->sp[M68K_SSP];
    case M68K_CR_ISP:
        return env->sp[M68K_ISP];
    /* MC68040/MC68LC040 */
    case M68K_CR_URP:
        return env->mmu.urp;
    case M68K_CR_ITT0:
        return env->mmu.ttr[M68K_ITTR0];
    case M68K_CR_ITT1:
        return env->mmu.ttr[M68K_ITTR1];
    case M68K_CR_DTT0:
        return env->mmu.ttr[M68K_DTTR0];
    case M68K_CR_DTT1:
        return env->mmu.ttr[M68K_DTTR1];
    }
    cpu_abort(env_cpu(env), "Unimplemented control register read 0x%x\n",
              reg);
}